

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

char * __thiscall Fossilize::StateReplayer::Impl::duplicate_string(Impl *this,char *str,size_t len)

{
  char *__dest;
  char *c;
  size_t len_local;
  char *str_local;
  Impl *this_local;
  
  __dest = ScratchAllocator::allocate_n<char>(&this->allocator,len + 1);
  memcpy(__dest,str,len);
  __dest[len] = '\0';
  return __dest;
}

Assistant:

const char *StateReplayer::Impl::duplicate_string(const char *str, size_t len)
{
	auto *c = allocator.allocate_n<char>(len + 1);
	memcpy(c, str, len);
	c[len] = '\0';
	return c;
}